

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this)

{
  *(undefined ***)&(this->super_IfcStructuralConnection).field_0x140 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x148 = 0;
  *(char **)&this->field_0x150 = "IfcStructuralSurfaceConnection";
  IfcStructuralConnection::IfcStructuralConnection
            (&this->super_IfcStructuralConnection,&PTR_construction_vtable_24__0075d888);
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x75d758;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x75d870;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0x75d780;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0x75d7a8;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0xd0 = 0x75d7d0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x100 = 0x75d7f8;
  (this->super_IfcStructuralConnection).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x75d820;
  *(undefined8 *)
   &(this->super_IfcStructuralConnection).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20 = 0x75d848;
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}